

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celfpp.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
CELFPP::celfppalgo(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
                  Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list,
                  CascadeModel model)

{
  _Head_base<0UL,_unsigned_long,_false> *__x;
  _Head_base<5UL,_double,_false> _Var1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined8 *puVar8;
  _Elt_pointer ptVar9;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *p_Var10;
  int iVar11;
  size_t j;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  undefined4 uVar19;
  int local_304;
  double local_300;
  int local_2f8;
  undefined8 uStack_2e0;
  ulong local_2d0;
  vector<double,_std::allocator<double>_> *local_2c8;
  double local_2c0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_2b8;
  double local_2a0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_298;
  tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> u;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecSeed;
  tuple<unsigned_long,_double,_int,_double,_int,_double> local_228;
  double local_1f8;
  undefined8 uStack_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1e0;
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  Q_CB;
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  Q_UC;
  _Elt_pointer local_138;
  _Elt_pointer local_130;
  _Elt_pointer local_118;
  _Elt_pointer local_110;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  _Elt_pointer local_98;
  _Elt_pointer ptStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  _Elt_pointer local_58;
  _Elt_pointer ptStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_2b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8 = budget_list;
  local_2a0 = budget;
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::_Deque_base(&Q_UC.
                 super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
               );
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::_Deque_base(&Q_CB.
                 super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
               );
  local_1e0 = __return_storage_ptr__;
  poVar6 = std::operator<<((ostream *)&std::cout,"Initial deque start");
  std::endl<char,std::char_traits<char>>(poVar6);
  vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar13 = 0.0;
  local_300 = 0.0;
  uVar7 = 0xffffffffffffffff;
  local_304 = -1;
  for (local_2d0 = 0;
      local_2d0 <
      (ulong)(((long)(graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(graph->
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x18); local_2d0 = local_2d0 + 1)
  {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&vecSeed,&local_2d0);
    dVar14 = GraphBase::inf_eval(graph,&vecSeed,model,10000);
    for (uVar12 = 0;
        uVar12 < (ulong)((long)vecSeed.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)vecSeed.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1)
    {
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar6," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar18 = SUB84(dVar14,0);
    uVar19 = (undefined4)((ulong)dVar14 >> 0x20);
    iVar11 = (int)uVar7;
    if (iVar11 != -1) {
      u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
      super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
      super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
      super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
      super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
      super__Head_base<5UL,_double,_false>._M_head_impl =
           (_Head_base<5UL,_double,_false>)(long)iVar11;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&vecSeed,(unsigned_long *)&u);
      dVar15 = GraphBase::inf_eval(graph,&vecSeed,model,10000);
      for (uVar12 = 0;
          uVar12 < (ulong)((long)vecSeed.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)vecSeed.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1
          ) {
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar6," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      uVar18 = SUB84(dVar15,0);
      uVar19 = (undefined4)((ulong)dVar15 >> 0x20);
    }
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.
    super__Tuple_impl<2UL,_int,_double,_int,_double>.super__Tuple_impl<3UL,_double,_int,_double>.
    super__Tuple_impl<4UL,_int,_double>.super__Tuple_impl<5UL,_double>.
    super__Head_base<5UL,_double,_false>._M_head_impl =
         (_Head_base<5UL,_double,_false>)
         (local_2c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[local_2d0];
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.
    super__Tuple_impl<2UL,_int,_double,_int,_double>.super__Tuple_impl<3UL,_double,_int,_double>.
    super__Tuple_impl<4UL,_int,_double>.super__Head_base<4UL,_int,_false>._M_head_impl = 0;
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.
    super__Tuple_impl<2UL,_int,_double,_int,_double>.super__Tuple_impl<3UL,_double,_int,_double>.
    super__Head_base<3UL,_double,_false>._M_head_impl = (double)CONCAT44(uVar19,uVar18);
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = local_2d0;
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.
    super__Tuple_impl<2UL,_int,_double,_int,_double>.super__Head_base<2UL,_int,_false>._M_head_impl
         = iVar11;
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = dVar14;
    std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>::
    tuple<unsigned_long,_double,_int,_double,_int,_double,_true,_true>(&u,&local_228);
    std::
    deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
    ::emplace_back<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>
              ((deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
                *)&Q_UC,&u);
    if ((iVar11 == -1) || (local_300 < dVar14)) {
      uVar7 = local_2d0 & 0xffffffff;
      local_300 = dVar14;
    }
    _Var1._M_head_impl =
         (local_2c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[local_2d0];
    dVar14 = dVar14 / _Var1._M_head_impl;
    dVar15 = dVar14;
    if (local_304 != -1) {
      u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
      super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
      super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
      super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
      super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
      super__Head_base<5UL,_double,_false>._M_head_impl =
           (_Head_base<5UL,_double,_false>)(_Head_base<5UL,_double,_false>)(long)local_304;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&vecSeed,(unsigned_long *)&u);
      dVar15 = GraphBase::inf_eval(graph,&vecSeed,model,10000);
      pdVar2 = (local_2c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar15 = dVar15 / (pdVar2[local_2d0] + pdVar2[local_304]);
      for (uVar12 = 0;
          uVar12 < (ulong)((long)vecSeed.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)vecSeed.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1
          ) {
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar6," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      _Var1._M_head_impl =
           (local_2c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[local_2d0];
    }
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.
    super__Tuple_impl<2UL,_int,_double,_int,_double>.super__Tuple_impl<3UL,_double,_int,_double>.
    super__Tuple_impl<4UL,_int,_double>.super__Head_base<4UL,_int,_false>._M_head_impl = 0;
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.
    super__Tuple_impl<2UL,_int,_double,_int,_double>.super__Head_base<2UL,_int,_false>._M_head_impl
         = local_304;
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = local_2d0;
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.
    super__Tuple_impl<2UL,_int,_double,_int,_double>.super__Tuple_impl<3UL,_double,_int,_double>.
    super__Tuple_impl<4UL,_int,_double>.super__Tuple_impl<5UL,_double>.
    super__Head_base<5UL,_double,_false>._M_head_impl =
         (_Head_base<5UL,_double,_false>)(_Head_base<5UL,_double,_false>)_Var1._M_head_impl;
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.
    super__Tuple_impl<2UL,_int,_double,_int,_double>.super__Tuple_impl<3UL,_double,_int,_double>.
    super__Head_base<3UL,_double,_false>._M_head_impl = dVar15;
    local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = dVar14;
    std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>::
    tuple<unsigned_long,_double,_int,_double,_int,_double,_true,_true>(&u,&local_228);
    std::
    deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
    ::emplace_back<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>
              ((deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
                *)&Q_CB,&u);
    if ((local_304 == -1) || (dVar13 < dVar14)) {
      local_304 = (int)local_2d0;
      dVar13 = dVar14;
    }
    vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Initial deque end");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_58 = Q_UC.
             super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ptStack_50 = Q_UC.
               super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_48 = Q_UC.
             super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last._0_4_;
  uStack_44 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last._4_4_;
  uStack_40 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node._0_4_;
  uStack_3c = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node._4_4_;
  local_78 = Q_UC.
             super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_;
  uStack_74 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_;
  uStack_70 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first._0_4_;
  uStack_6c = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first._4_4_;
  local_68 = Q_UC.
             super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_;
  uStack_64 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_;
  uStack_60 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_;
  uStack_5c = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_;
  std::
  sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>
            ();
  local_98 = Q_CB.
             super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ptStack_90 = Q_CB.
               super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_88 = Q_CB.
             super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last._0_4_;
  uStack_84 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last._4_4_;
  uStack_80 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node._0_4_;
  uStack_7c = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node._4_4_;
  local_b8 = Q_CB.
             super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_;
  uStack_b4 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_;
  uStack_b0 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first._0_4_;
  uStack_ac = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first._4_4_;
  local_a8 = Q_CB.
             super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_;
  uStack_a4 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_;
  uStack_a0 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_;
  uStack_9c = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_;
  std::
  sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>
            ();
  poVar6 = std::operator<<((ostream *)&std::cout,"Start UC");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_2c0 = 0.0;
  local_2f8 = -1;
  __x = &u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
         super__Head_base<0UL,_unsigned_long,_false>;
  uVar12 = 0;
  while( true ) {
    auVar16._8_4_ = (int)(uVar12 >> 0x20);
    auVar16._0_8_ = uVar12;
    auVar16._12_4_ = 0x45300000;
    dVar15 = auVar16._8_8_ - 1.9342813113834067e+25;
    dVar14 = dVar15 + ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
    auVar3._8_4_ = SUB84(dVar15,0);
    auVar3._0_8_ = dVar14;
    auVar3._12_4_ = (int)((ulong)dVar15 >> 0x20);
    iVar11 = (int)uVar7;
    if (local_2a0 <= dVar14) break;
    do {
      if ((double)((Q_UC.
                    super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>)
                  .super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                  super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                  super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                  super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
                  super__Head_base<5UL,_double,_false> + dVar14 <= local_2a0) {
        ptVar9 = (_Elt_pointer)
                 CONCAT44(Q_UC.
                          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_,
                          Q_UC.
                          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_);
        break;
      }
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::pop_front(&Q_UC);
      ptVar9 = (_Elt_pointer)
               CONCAT44(Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_,
                        Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_);
    } while (ptVar9 != Q_UC.
                       super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur);
    if (ptVar9 == Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
    super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
    super__Head_base<5UL,_double,_false>._M_head_impl =
         ((Q_UC.
           super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
         super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
         super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
         super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
         super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
         super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
         super__Head_base<5UL,_double,_false>;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
    super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>.
    _M_head_impl = ((Q_UC.
                     super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                   ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                   super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                   super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                   super__Tuple_impl<4UL,_unsigned_long,_double>.
                   super__Head_base<4UL,_unsigned_long,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<3UL,_double,_unsigned_long,_double>.super__Head_base<3UL,_double,_false>.
    _M_head_impl = ((Q_UC.
                     super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                   ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                   super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                   super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                   super__Head_base<3UL,_double,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.super__Head_base<2UL,_int,_false>.
    _M_head_impl = ((Q_UC.
                     super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                   ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                   super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                   super__Head_base<2UL,_int,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>._28_4_ =
         *(undefined4 *)
          &((Q_UC.
             super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.field_0x1c;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Head_base<1UL,_double,_false>._M_head_impl =
         ((Q_UC.
           super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
         super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
         super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
         super__Head_base<1UL,_double,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         ((Q_UC.
           super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
         super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    if (u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
        super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>.
        _M_head_impl ==
        (long)local_2b8._M_impl.super__Vector_impl_data._M_finish -
        (long)local_2b8._M_impl.super__Vector_impl_data._M_start >> 3) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2b8,
                 &__x->_M_head_impl);
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::pop_front(&Q_UC);
      uStack_2e0 = auVar3._8_8_;
      dVar14 = dVar14 + (double)u.
                                super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                .super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                                super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                                super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                                super__Tuple_impl<4UL,_unsigned_long,_double>.
                                super__Tuple_impl<5UL,_double>.super__Head_base<5UL,_double,_false>.
                                _M_head_impl;
      local_1f8 = dVar14 - 9.223372036854776e+18;
      uStack_1f0 = uStack_2e0;
      local_2c0 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )&local_2b8,model,10000);
      local_2f8 = (int)u.
                       super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      poVar6 = std::operator<<((ostream *)&std::cout,"UC push new seed: ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6," ");
      dVar15 = sum_budget(local_2c8,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2b8);
      poVar6 = std::ostream::_M_insert<double>(dVar15);
      std::operator<<(poVar6," ");
      poVar6 = std::ostream::_M_insert<double>(local_2c0);
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar12 = (ulong)dVar14;
      uVar12 = (long)local_1f8 & (long)uVar12 >> 0x3f | uVar12;
    }
    else {
      if (u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
          super__Head_base<2UL,_int,_false>._M_head_impl == local_2f8) {
        ((Q_UC.
          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)->
        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Head_base<1UL,_double,_false>._M_head_impl =
             ((Q_UC.
               super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
             super__Head_base<3UL,_double,_false>._M_head_impl;
        poVar6 = std::operator<<((ostream *)&std::cout,"last seed");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2b8,
                   &__x->_M_head_impl);
        dVar14 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &local_2b8,model,10000);
        ((Q_UC.
          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)->
        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Head_base<1UL,_double,_false>._M_head_impl = dVar14 - local_2c0;
        local_2b8._M_impl.super__Vector_impl_data._M_finish =
             local_2b8._M_impl.super__Vector_impl_data._M_finish + -1;
        ((Q_UC.
          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)->
        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.super__Head_base<2UL,_int,_false>
        ._M_head_impl = iVar11;
        local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
        super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.
        super__Tuple_impl<2UL,_int,_double,_int,_double>.super__Tuple_impl<3UL,_double,_int,_double>
        .super__Tuple_impl<4UL,_int,_double>.super__Tuple_impl<5UL,_double>.
        super__Head_base<5UL,_double,_false>._M_head_impl =
             (_Head_base<5UL,_double,_false>)(long)iVar11;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2b8,
                   (unsigned_long *)&local_228);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2b8,
                   &__x->_M_head_impl);
        dVar14 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &local_2b8,model,10000);
        ((Q_UC.
          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)->
        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<3UL,_double,_unsigned_long,_double>.super__Head_base<3UL,_double,_false>.
        _M_head_impl = dVar14 - local_2c0;
        local_2b8._M_impl.super__Vector_impl_data._M_finish =
             local_2b8._M_impl.super__Vector_impl_data._M_finish + -2;
      }
      if (iVar11 == -1) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = "cur_best_UC should not be -1";
        __cxa_throw(puVar8,&char_const*::typeinfo,0);
      }
      if (local_300 <
          ((Q_UC.
            super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Head_base<1UL,_double,_false>._M_head_impl) {
        uVar7 = (ulong)(uint)((Q_UC.
                               super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                             ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      }
      ((Q_UC.
        super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur)->
      super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
      super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
      super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
      super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
      super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>.
      _M_head_impl = (long)local_2b8._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_2b8._M_impl.super__Vector_impl_data._M_start >> 3;
      local_118 = Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_110 = Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first;
      std::
      sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>
                (&local_118,local_d8);
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"End UC");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Start CB");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_300 = 0.0;
  uVar7 = 0;
  while( true ) {
    auVar17._8_4_ = (int)(uVar7 >> 0x20);
    auVar17._0_8_ = uVar7;
    auVar17._12_4_ = 0x45300000;
    dVar15 = auVar17._8_8_ - 1.9342813113834067e+25;
    dVar14 = dVar15 + ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
    auVar4._8_4_ = SUB84(dVar15,0);
    auVar4._0_8_ = dVar14;
    auVar4._12_4_ = (int)((ulong)dVar15 >> 0x20);
    if (local_2a0 <= dVar14) break;
    do {
      if ((double)((Q_CB.
                    super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>)
                  .super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                  super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                  super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                  super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
                  super__Head_base<5UL,_double,_false> + dVar14 <= local_2a0) {
        ptVar9 = (_Elt_pointer)
                 CONCAT44(Q_CB.
                          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_,
                          Q_CB.
                          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_);
        break;
      }
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::pop_front(&Q_CB);
      ptVar9 = (_Elt_pointer)
               CONCAT44(Q_CB.
                        super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_,
                        Q_CB.
                        super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_);
    } while (ptVar9 != Q_CB.
                       super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur);
    if (ptVar9 == Q_CB.
                  super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
    super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
    super__Head_base<5UL,_double,_false>._M_head_impl =
         ((Q_CB.
           super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
         super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
         super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
         super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
         super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
         super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
         super__Head_base<5UL,_double,_false>;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
    super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>.
    _M_head_impl = ((Q_CB.
                     super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                   ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                   super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                   super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                   super__Tuple_impl<4UL,_unsigned_long,_double>.
                   super__Head_base<4UL,_unsigned_long,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<3UL,_double,_unsigned_long,_double>.super__Head_base<3UL,_double,_false>.
    _M_head_impl = ((Q_CB.
                     super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                   ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                   super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                   super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                   super__Head_base<3UL,_double,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.super__Head_base<2UL,_int,_false>.
    _M_head_impl = ((Q_CB.
                     super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                   ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                   super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                   super__Head_base<2UL,_int,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>._28_4_ =
         *(undefined4 *)
          &((Q_CB.
             super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.field_0x1c;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
    super__Head_base<1UL,_double,_false>._M_head_impl =
         ((Q_CB.
           super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
         super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
         super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
         super__Head_base<1UL,_double,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         ((Q_CB.
           super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
         super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    if (u.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
        super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>.
        _M_head_impl ==
        (long)local_298._M_impl.super__Vector_impl_data._M_finish -
        (long)local_298._M_impl.super__Vector_impl_data._M_start >> 3) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                 &u.
                  super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>.
                  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
      std::
      deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
      ::pop_front(&Q_CB);
      uStack_2e0 = auVar4._8_8_;
      dVar14 = dVar14 + (double)u.
                                super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                .super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                                super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                                super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                                super__Tuple_impl<4UL,_unsigned_long,_double>.
                                super__Tuple_impl<5UL,_double>.super__Head_base<5UL,_double,_false>.
                                _M_head_impl;
      local_1f8 = dVar14 - 9.223372036854776e+18;
      uStack_1f0 = uStack_2e0;
      local_300 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )&local_298,model,10000);
      local_2f8 = (int)u.
                       super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      poVar6 = std::operator<<((ostream *)&std::cout,"UC push new seed: ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6," ");
      dVar15 = sum_budget(local_2c8,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298);
      poVar6 = std::ostream::_M_insert<double>(dVar15);
      std::operator<<(poVar6," ");
      poVar6 = std::ostream::_M_insert<double>(local_300);
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar7 = (ulong)dVar14;
      uVar7 = (long)local_1f8 & (long)uVar7 >> 0x3f | uVar7;
    }
    else {
      if (((Q_CB.
            super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
          super__Head_base<2UL,_int,_false>._M_head_impl == local_2f8) {
        ((Q_CB.
          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)->
        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Head_base<1UL,_double,_false>._M_head_impl =
             ((Q_CB.
               super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
             super__Head_base<3UL,_double,_false>._M_head_impl;
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                   &u.
                    super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
        dVar14 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &local_298,model,10000);
        ((Q_CB.
          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)->
        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Head_base<1UL,_double,_false>._M_head_impl =
             (dVar14 - local_300) /
             (double)u.
                     super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                     .super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                     super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                     super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                     super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
                     super__Head_base<5UL,_double,_false>._M_head_impl;
        local_298._M_impl.super__Vector_impl_data._M_finish =
             local_298._M_impl.super__Vector_impl_data._M_finish + -1;
        ((Q_CB.
          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)->
        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.super__Head_base<2UL,_int,_false>
        ._M_head_impl = local_304;
        local_228.super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_int,_double>.
        super__Tuple_impl<1UL,_double,_int,_double,_int,_double>.
        super__Tuple_impl<2UL,_int,_double,_int,_double>.super__Tuple_impl<3UL,_double,_int,_double>
        .super__Tuple_impl<4UL,_int,_double>.super__Tuple_impl<5UL,_double>.
        super__Head_base<5UL,_double,_false>._M_head_impl =
             (_Head_base<5UL,_double,_false>)(_Head_base<5UL,_double,_false>)(long)local_304;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                   (unsigned_long *)&local_228);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                   &u.
                    super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
        dVar14 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &local_298,model,10000);
        ((Q_CB.
          super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur)->
        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<3UL,_double,_unsigned_long,_double>.super__Head_base<3UL,_double,_false>.
        _M_head_impl = (dVar14 - local_300) /
                       ((double)u.
                                super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                                .super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                                super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                                super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                                super__Tuple_impl<4UL,_unsigned_long,_double>.
                                super__Tuple_impl<5UL,_double>.super__Head_base<5UL,_double,_false>.
                                _M_head_impl +
                       (local_2c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[local_304]);
        local_298._M_impl.super__Vector_impl_data._M_finish =
             local_298._M_impl.super__Vector_impl_data._M_finish + -2;
      }
      if (local_304 == -1) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = "cur_best_CB should not be -1";
        __cxa_throw(puVar8,&char_const*::typeinfo,0);
      }
      if (dVar13 < ((Q_CB.
                     super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                   ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                   super__Head_base<1UL,_double,_false>._M_head_impl) {
        local_304 = (int)((Q_CB.
                           super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                         super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                         ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      }
      ((Q_CB.
        super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur)->
      super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
      super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
      super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
      super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
      super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>.
      _M_head_impl = (long)local_298._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_298._M_impl.super__Vector_impl_data._M_start >> 3;
      local_138 = Q_CB.
                  super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_130 = Q_CB.
                  super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first;
      std::
      sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>
                (&local_138,local_f8);
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"End CB");
  p_Var10 = &local_2b8;
  std::endl<char,std::char_traits<char>>(poVar6);
  if (local_300 <= local_2c0) {
    std::operator<<((ostream *)&std::cout,"UC_inf: ");
    poVar6 = std::ostream::_M_insert<double>(local_2c0);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    std::operator<<((ostream *)&std::cout,"CB_inf: ");
    poVar6 = std::ostream::_M_insert<double>(local_300);
    std::endl<char,std::char_traits<char>>(poVar6);
    p_Var10 = &local_298;
  }
  pvVar5 = local_1e0;
  (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var10->_M_impl)->_M_impl)
       .super__Vector_impl_data._M_start;
  (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var10->_M_impl)->_M_impl)
       .super__Vector_impl_data._M_finish;
  (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var10->_M_impl)->_M_impl)
       .super__Vector_impl_data._M_end_of_storage;
  (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var10->_M_impl)->_M_impl).
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var10->_M_impl)->_M_impl).
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var10->_M_impl)->_M_impl).
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::~_Deque_base(&Q_CB.
                  super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                );
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::~_Deque_base(&Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
                );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_298);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_2b8);
  return pvVar5;
}

Assistant:

static std::vector<size_t> celfppalgo (const Graph & graph, const double budget,
            const std::vector<double> & budget_list, const CascadeModel model) {
        std::vector<size_t> S_UC;
        std::vector<size_t> S_CB;
        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::deque<std::tuple<size_t, double, int, double, size_t, double>> Q_UC;
        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::deque<std::tuple<size_t, double, int, double, size_t, double>> Q_CB;

        int last_seed = -1;
        int cur_best_UC = -1;
        double cur_best_UC_mg1 = 0;
        int cur_best_CB = -1;
        double cur_best_CB_mg1 = 0;
        double mg1_UC = 0;
        double mg1_CB = 0;
        double mg2_UC = 0;
        double mg2_CB = 0;
        std::cout << "Initial deque start" << std::endl;
        std::vector<size_t> vecSeed;
        for (size_t i = 0; i < graph.size(); i++) {
            vecSeed.push_back(i);

            // initial UC
            mg1_UC = GraphBase::inf_eval(graph, vecSeed, model);
            for (size_t j = 0; j < vecSeed.size(); j++) {
                std::cout << vecSeed[j] << " ";
            }
            std::cout << std::endl;
            if (cur_best_UC != -1) {
                vecSeed.push_back(cur_best_UC);
                mg2_UC = GraphBase::inf_eval(graph, vecSeed, model);
                for (size_t j = 0; j < vecSeed.size(); j++) {
                    std::cout << vecSeed[j] << " ";
                }
                std::cout << std::endl;
                vecSeed.pop_back();
            }
            else {
                mg2_UC = mg1_UC;
            }
            // u u.mg1 u.prev_best u.mg2 u.flag u.cost
            Q_UC.push_back(std::make_tuple(i, mg1_UC, cur_best_UC, mg2_UC, 0, budget_list[i]));
            if (cur_best_UC == -1) {
                cur_best_UC = i;
                cur_best_UC_mg1 = mg1_UC;
            }
            else {
                if(cur_best_UC_mg1 < mg1_UC) {
                    cur_best_UC = i;
                    cur_best_UC_mg1 = mg1_UC;
                }
            }

            // initial CB
            mg1_CB = mg1_UC / budget_list[i];
            if (cur_best_CB != -1) {
                vecSeed.push_back(cur_best_CB);
                mg2_CB = GraphBase::inf_eval(graph, vecSeed, model) / (budget_list[i] + budget_list[cur_best_CB]);
                for (size_t j = 0; j < vecSeed.size(); j++) {
                    std::cout << vecSeed[j] << " ";
                }
                std::cout << std::endl;
                vecSeed.pop_back();
            }
            else {
                mg2_CB = mg1_CB;
            }

            // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
            Q_CB.push_back(std::make_tuple(i, mg1_CB, cur_best_CB, mg2_CB, 0, budget_list[i]));
            if (cur_best_CB == -1) {
                cur_best_CB = i;
                cur_best_CB_mg1 = mg1_CB;
            }
            else {
                if (cur_best_CB_mg1 < mg1_CB) {
                    cur_best_CB = i;
                    cur_best_CB_mg1 = mg1_CB;
                }
            }
            vecSeed.pop_back();
        }
        std::cout << "Initial deque end" << std::endl;

        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<5>(left) < std::get<5>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<5>(left) < std::get<5>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::cout << "Start UC" << std::endl;
        size_t budget_UC = 0;
        double S_UC_inf = 0;
        while (budget_UC < budget) {
            while (std::get<5>(Q_UC.front()) + budget_UC > budget) {
                Q_UC.pop_front();
                if (Q_UC.empty()) {
                    break;
                }
            }
            if (Q_UC.empty()) {
                break;
            }
            // u u.mg1 u.prev_best u.mg2 u.flag u.cost
            std::tuple<size_t, double, int, double, size_t, double> u = Q_UC.front();
            if (std::get<4>(u) == S_UC.size()) {
                S_UC.push_back(std::get<0>(u));
                Q_UC.pop_front();
                budget_UC = budget_UC + std::get<5>(u);
                S_UC_inf = GraphBase::inf_eval(graph, S_UC, model);
                last_seed = std::get<0>(u);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_UC.size() << " " <<
                          sum_budget(budget_list, S_UC) << " " << S_UC_inf << std::endl;
                continue;
            }
            else if (std::get<2>(u) == last_seed) {
                std::get<1>(Q_UC.front()) = std::get<3>(Q_UC.front());   // u u.mg1 u.prev_best u.mg2 u.flag u.cost
                std::cout << "last seed" << std::endl;
            }
            else {
                S_UC.push_back(std::get<0>(u));
                std::get<1>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                std::get<2>(Q_UC.front()) = cur_best_UC;
                S_UC.push_back(cur_best_UC);
                S_UC.push_back(std::get<0>(u));
                std::get<3>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                S_UC.pop_back();
            }

            if (cur_best_UC != -1){
                if (cur_best_UC_mg1 < std::get<1>(Q_UC.front())) {
                    cur_best_UC = std::get<0>(Q_UC.front());
                }
            }
            else {
                throw "cur_best_UC should not be -1";
            }

            std::get<4>(Q_UC.front()) = S_UC.size();
            std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
                if (std::get<1>(left) == std::get<1>(right)) {
                    return std::get<5>(left) < std::get<5>(right);
                }
                else {
                    return std::get<1>(left) > std::get<1>(right);
                }
            });
        }
        std::cout << "End UC" << std::endl;

        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::cout << "Start CB" << std::endl;
        size_t budget_CB = 0;
        double S_CB_inf = 0;
        while (budget_CB < budget) {
            while (std::get<5>(Q_CB.front()) + budget_CB > budget) {
                Q_CB.pop_front();
                if (Q_CB.empty()) {
                    break;
                }
            }
            if (Q_CB.empty()) {
                break;
            }
            // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
            std::tuple<size_t, double, int, double, size_t, double> u = Q_CB.front();
            if (std::get<4>(u) == S_CB.size()) {
                S_CB.push_back(std::get<0>(u));
                Q_CB.pop_front();
                budget_CB = budget_CB + std::get<5>(u);
                S_CB_inf = GraphBase::inf_eval(graph, S_CB, model);
                last_seed = std::get<0>(u);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_CB.size() << " " <<
                          sum_budget(budget_list, S_CB) << " " << S_CB_inf << std::endl;
                continue;
            }
            else if (std::get<2>(u) == last_seed) {
                // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
                std::get<1>(Q_CB.front()) = std::get<3>(Q_CB.front());
            }
            else {
                S_CB.push_back(std::get<0>(u));
                std::get<1>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) / std::get<5>(u);
                S_CB.pop_back();
                std::get<2>(Q_CB.front()) = cur_best_CB;
                S_CB.push_back(cur_best_CB);
                S_CB.push_back(std::get<0>(u));
                std::get<3>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) /
                        (std::get<5>(u) + budget_list[cur_best_CB]);
                S_CB.pop_back();
                S_CB.pop_back();
            }
            if (cur_best_CB != -1){
                if(cur_best_CB_mg1 < std::get<1>(Q_CB.front())){
                    cur_best_CB = std::get<0>(Q_CB.front());
                }
            }
            else {
                throw "cur_best_CB should not be -1";
            }
            std::get<4>(Q_CB.front()) = S_CB.size();
            std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
                if (std::get<1>(left) == std::get<1>(right)) {
                    return std::get<5>(left) < std::get<5>(right);
                }
                else {
                    return std::get<1>(left) > std::get<1>(right);
                }
            });
        }
        std::cout << "End CB" << std::endl;

        if (S_CB_inf > S_UC_inf) {
            std::cout << "CB_inf: " << S_CB_inf << std::endl;
            return S_CB;
        }
        else {
            std::cout << "UC_inf: " << S_UC_inf << std::endl;
            return S_UC;
        }
    }